

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ParameterString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearSpectrum *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  SpectrumHandle *in_RDX;
  ulong uVar1;
  float *in_R8;
  long lVar2;
  string name;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_78 = (ulong)this | 0x3000000000000;
  FindMatchingNamedSpectrum_abi_cxx11_(&local_70,(pbrt *)&local_78,in_RDX);
  if (local_70._M_string_length == 0) {
    lVar2 = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (uVar1 = 0; uVar1 < (this->lambdas).nStored; uVar1 = uVar1 + 1) {
      StringPrintf<float_const&,float_const&>
                (&local_50,(pbrt *)"%f %f ",(char *)((long)(this->lambdas).ptr + lVar2),
                 (float *)((long)(this->values).ptr + lVar2),in_R8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      lVar2 = lVar2 + 4;
    }
  }
  else {
    StringPrintf<std::__cxx11::string&>
              (__return_storage_ptr__,(pbrt *)0x497d13,(char *)&local_70,in_RCX);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string PiecewiseLinearSpectrum::ParameterString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret;
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret;
}